

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O2

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle>::TPZMultiphysicsCompEl
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle> *this)

{
  *(undefined ***)&(this->super_TPZMultiphysicsElement).super_TPZCompEl = &PTR__TPZSavable_01777648;
  TPZMultiphysicsElement::TPZMultiphysicsElement
            (&this->super_TPZMultiphysicsElement,&PTR_PTR_01775048);
  *(undefined ***)&(this->super_TPZMultiphysicsElement).super_TPZCompEl =
       &PTR__TPZMultiphysicsCompEl_01774d38;
  TPZManVector<TPZCompElSide,_5>::TPZManVector(&this->fElementVec,0);
  (this->fConnectIndexes)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  (this->fConnectIndexes).fStore = (long *)0x0;
  (this->fConnectIndexes).fNElements = 0;
  (this->fConnectIndexes).fNAlloc = 0;
  TPZIntTriang::TPZIntTriang(&this->fIntRule,2);
  return;
}

Assistant:

TPZMultiphysicsCompEl<TGeometry>::TPZMultiphysicsCompEl() : TPZRegisterClassId(&TPZMultiphysicsCompEl::ClassId),
TPZMultiphysicsElement(), fElementVec(0){
}